

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int CompareXform(ON_Xform *a,ON_Xform *b)

{
  double *local_30;
  double *db;
  double *da;
  int j;
  int i;
  ON_Xform *b_local;
  ON_Xform *a_local;
  
  da._4_4_ = 0x10;
  da._0_4_ = 0;
  local_30 = (double *)b;
  db = (double *)a;
  while (da._4_4_ != 0 && (int)da == 0) {
    da._0_4_ = CompareDouble(*db,*local_30);
    local_30 = local_30 + 1;
    db = db + 1;
    da._4_4_ = da._4_4_ + -1;
  }
  return (int)da;
}

Assistant:

static int CompareXform( const ON_Xform& a, const ON_Xform& b )
{
  int i,j;
  const double* da = &a.m_xform[0][0];
  const double* db = &b.m_xform[0][0];
  i = 16;
  j = 0;
  while ( i-- && !j)
  {
    j = CompareDouble(*da++,*db++);
  }

  return j;
}